

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O1

void __thiscall QOpenGLWindowPrivate::initialize(QOpenGLWindowPrivate *this)

{
  QOpenGLWindow *pQVar1;
  QOpenGLContext *pQVar2;
  QSurfaceFormat *pQVar3;
  QOpenGLWindowPaintDevice *pQVar4;
  char cVar5;
  bool bVar6;
  long lVar7;
  QOpenGLContext *this_00;
  QOpenGLWindowPaintDevice *this_01;
  long in_FS_OFFSET;
  QSurfaceFormat local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->context).d == (QOpenGLContext *)0x0) {
    pQVar1 = *(QOpenGLWindow **)&this->field_0x8;
    lVar7 = QWindow::handle();
    if (lVar7 == 0) {
      initialize();
    }
    this_00 = (QOpenGLContext *)operator_new(0x10);
    QOpenGLContext::QOpenGLContext(this_00,(QObject *)0x0);
    pQVar2 = (this->context).d;
    if ((pQVar2 != this_00) && ((this->context).d = this_00, pQVar2 != (QOpenGLContext *)0x0)) {
      (**(code **)(*(long *)pQVar2 + 0x20))();
    }
    QOpenGLContext::setShareContext((this->context).d);
    pQVar3 = (QSurfaceFormat *)(this->context).d;
    QWindow::requestedFormat();
    QOpenGLContext::setFormat(pQVar3);
    QSurfaceFormat::~QSurfaceFormat(local_30);
    cVar5 = QOpenGLContext::create();
    if (cVar5 == '\0') {
      initialize();
    }
    cVar5 = QOpenGLContext::makeCurrent((QSurface *)(this->context).d);
    if (cVar5 == '\0') {
      initialize();
    }
    this_01 = (QOpenGLWindowPaintDevice *)operator_new(0x20);
    QOpenGLPaintDevice::QOpenGLPaintDevice((QOpenGLPaintDevice *)this_01);
    *(undefined ***)&this_01->super_QOpenGLPaintDevice = &PTR__QOpenGLPaintDevice_001a29c8;
    this_01->m_window = pQVar1;
    pQVar4 = (this->paintDevice).d;
    if ((pQVar4 != this_01) &&
       ((this->paintDevice).d = this_01, pQVar4 != (QOpenGLWindowPaintDevice *)0x0)) {
      (**(code **)(*(long *)&pQVar4->super_QOpenGLPaintDevice + 8))();
    }
    if (this->updateBehavior == PartialUpdateBlit) {
      bVar6 = QOpenGLFramebufferObject::hasOpenGLFramebufferBlit();
      this->hasFboBlit = bVar6;
    }
    (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLWindowPrivate::initialize()
{
    Q_Q(QOpenGLWindow);

    if (context)
        return;

    if (!q->handle())
        qWarning("Attempted to initialize QOpenGLWindow without a platform window");

    context.reset(new QOpenGLContext);
    context->setShareContext(shareContext);
    context->setFormat(q->requestedFormat());
    if (!context->create())
        qWarning("QOpenGLWindow::beginPaint: Failed to create context");
    if (!context->makeCurrent(q))
        qWarning("QOpenGLWindow::beginPaint: Failed to make context current");

    paintDevice.reset(new QOpenGLWindowPaintDevice(q));
    if (updateBehavior == QOpenGLWindow::PartialUpdateBlit)
        hasFboBlit = QOpenGLFramebufferObject::hasOpenGLFramebufferBlit();

    q->initializeGL();
}